

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O1

void png_handle_sBIT(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  png_byte pVar1;
  int iVar2;
  ulong uVar3;
  png_byte *ppVar4;
  char *error_message;
  byte bVar5;
  uint length_00;
  undefined4 local_2c;
  
  if ((png_ptr->mode & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if ((png_ptr->mode & 6) == 0) {
    if ((info_ptr == (png_inforp)0x0) || ((info_ptr->valid & 2) == 0)) {
      if (png_ptr->color_type == '\x03') {
        bVar5 = 8;
        length_00 = 3;
      }
      else {
        length_00 = (uint)png_ptr->channels;
        bVar5 = png_ptr->bit_depth;
      }
      if (length < 5 && length_00 == length) {
        local_2c = (uint)bVar5 * 0x1010101;
        png_crc_read(png_ptr,(png_bytep)&local_2c,length_00);
        iVar2 = png_crc_finish(png_ptr,0);
        if (iVar2 == 0) {
          if (length_00 != 0) {
            uVar3 = 0;
            do {
              if (bVar5 <= (byte)(*(char *)((long)&local_2c + uVar3) - 1U)) {
                png_chunk_benign_error(png_ptr,"invalid");
                return;
              }
              uVar3 = uVar3 + 1;
            } while (length_00 != uVar3);
          }
          if ((png_ptr->color_type & 2) == 0) {
            ppVar4 = (png_byte *)((long)&local_2c + 1);
            (png_ptr->sig_bit).gray = (png_byte)local_2c;
            (png_ptr->sig_bit).red = (png_byte)local_2c;
            (png_ptr->sig_bit).green = (png_byte)local_2c;
            pVar1 = (png_byte)local_2c;
          }
          else {
            ppVar4 = (png_byte *)((long)&local_2c + 3);
            (png_ptr->sig_bit).red = (png_byte)local_2c;
            (png_ptr->sig_bit).green = local_2c._1_1_;
            pVar1 = local_2c._2_1_;
          }
          (png_ptr->sig_bit).blue = pVar1;
          (png_ptr->sig_bit).alpha = *ppVar4;
          png_set_sBIT(png_ptr,info_ptr,&png_ptr->sig_bit);
        }
        return;
      }
      png_chunk_benign_error(png_ptr,"invalid");
      png_crc_finish(png_ptr,length);
      return;
    }
    png_crc_finish(png_ptr,length);
    error_message = "duplicate";
  }
  else {
    png_crc_finish(png_ptr,length);
    error_message = "out of place";
  }
  png_chunk_benign_error(png_ptr,error_message);
  return;
}

Assistant:

void /* PRIVATE */
png_handle_sBIT(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   unsigned int truelen, i;
   png_byte sample_depth;
   png_byte buf[4];

   png_debug(1, "in png_handle_sBIT");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & (PNG_HAVE_IDAT|PNG_HAVE_PLTE)) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   if (info_ptr != NULL && (info_ptr->valid & PNG_INFO_sBIT) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   if (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE)
   {
      truelen = 3;
      sample_depth = 8;
   }

   else
   {
      truelen = png_ptr->channels;
      sample_depth = png_ptr->bit_depth;
   }

   if (length != truelen || length > 4)
   {
      png_chunk_benign_error(png_ptr, "invalid");
      png_crc_finish(png_ptr, length);
      return;
   }

   buf[0] = buf[1] = buf[2] = buf[3] = sample_depth;
   png_crc_read(png_ptr, buf, truelen);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   for (i=0; i<truelen; ++i)
   {
      if (buf[i] == 0 || buf[i] > sample_depth)
      {
         png_chunk_benign_error(png_ptr, "invalid");
         return;
      }
   }

   if ((png_ptr->color_type & PNG_COLOR_MASK_COLOR) != 0)
   {
      png_ptr->sig_bit.red = buf[0];
      png_ptr->sig_bit.green = buf[1];
      png_ptr->sig_bit.blue = buf[2];
      png_ptr->sig_bit.alpha = buf[3];
   }

   else
   {
      png_ptr->sig_bit.gray = buf[0];
      png_ptr->sig_bit.red = buf[0];
      png_ptr->sig_bit.green = buf[0];
      png_ptr->sig_bit.blue = buf[0];
      png_ptr->sig_bit.alpha = buf[1];
   }

   png_set_sBIT(png_ptr, info_ptr, &(png_ptr->sig_bit));
}